

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall
CMU462::Camera::place
          (Camera *this,Vector3D *targetPos,double phi,double theta,double r,double minR,double maxR
          )

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double local_60;
  double phi_;
  double r_;
  double maxR_local;
  double minR_local;
  double r_local;
  double theta_local;
  double phi_local;
  Vector3D *targetPos_local;
  Camera *this_local;
  
  r_ = maxR;
  maxR_local = minR;
  minR_local = r;
  r_local = theta;
  theta_local = phi;
  phi_local = (double)targetPos;
  targetPos_local = (Vector3D *)this;
  pdVar2 = std::max<double>(&minR_local,&maxR_local);
  pdVar2 = std::min<double>(pdVar2,&r_);
  dVar1 = *pdVar2;
  dVar3 = sin(theta_local);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    local_60 = theta_local;
  }
  else {
    local_60 = theta_local + 9.999999747378752e-06;
  }
  (this->targetPos).x = *(double *)phi_local;
  (this->targetPos).y = *(double *)((long)phi_local + 8);
  (this->targetPos).z = *(double *)((long)phi_local + 0x10);
  this->phi = local_60;
  this->theta = r_local;
  this->r = dVar1;
  this->minR = maxR_local;
  this->maxR = r_;
  compute_position(this);
  return;
}

Assistant:

void Camera::place(const Vector3D& targetPos, const double phi,
      const double theta, const double r, const double minR,
      const double maxR) {
    double r_ = min(max(r, minR), maxR);
    double phi_ = (sin(phi) == 0) ? (phi + EPS_F) : phi;
    this->targetPos = targetPos;
    this->phi = phi_;
    this->theta = theta;
    this->r = r_;
    this->minR = minR;
    this->maxR = maxR;
    compute_position();
  }